

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O3

vm_obj_id_t CVmObjByteArray::create_from_string(vm_val_t *strval,char *str,vm_val_t *mapval)

{
  CVmObjPageEntry *pCVar1;
  vm_obj_id_t vVar2;
  wchar_t wVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  byte *pbVar7;
  byte *src_byte_len;
  ulong uVar8;
  size_t sVar9;
  unsigned_long ele_count;
  ulong uVar10;
  ulong uVar11;
  ulong __n;
  byte *src;
  long lVar12;
  char *pcVar13;
  bool bVar14;
  size_t src_bytes_used;
  uchar buf [256];
  long local_160;
  size_t local_148;
  CCharmapToLocal *local_140;
  char local_138 [264];
  
  src_byte_len = (byte *)(ulong)*(ushort *)str;
  src = (byte *)(str + 2);
  if ((mapval == (vm_val_t *)0x0) || (mapval->typ == VM_NIL)) {
    if (src_byte_len == (byte *)0x0) {
      vVar2 = create(0,0);
      return vVar2;
    }
    ele_count = 0;
    pbVar7 = src;
    do {
      pbVar7 = pbVar7 + (ulong)(((*pbVar7 >> 5 & 1) != 0) + 1 & (uint)(*pbVar7 >> 7) * 3) + 1;
      ele_count = ele_count + 1;
    } while (pbVar7 < src + (long)src_byte_len);
    vVar2 = create(0,ele_count);
    if (src_byte_len != (byte *)0x0) {
      pCVar1 = G_obj_table_X.pages_[vVar2 >> 0xc];
      lVar5 = 1;
      do {
        uVar8 = 0;
        pbVar7 = src;
        do {
          wVar3 = utf8_ptr::s_getch((char *)pbVar7);
          if (L'ÿ' < wVar3) {
            err_throw(0x7e7);
          }
          uVar11 = uVar8 + 1;
          local_138[uVar8] = (char)wVar3;
          src = pbVar7 + (ulong)(((*pbVar7 >> 5 & 1) != 0) + 1 & (uint)(*pbVar7 >> 7) * 3) + 1;
          src_byte_len = pbVar7 + ((long)src_byte_len - (long)src);
        } while ((src_byte_len != (byte *)0x0) &&
                (bVar14 = uVar8 < 0xff, uVar8 = uVar11, pbVar7 = src, bVar14));
        pcVar13 = local_138;
        uVar8 = uVar11;
        lVar12 = (long)(int)lVar5;
        do {
          uVar4 = (uint)(lVar12 - 1U);
          uVar10 = (ulong)(uVar4 & 0x7fff);
          __n = 0x8000 - uVar10;
          if (uVar8 <= __n) {
            __n = uVar8;
          }
          memcpy((void *)(uVar10 + *(long *)(*(long *)(*(long *)((long)&pCVar1[vVar2 & 0xfff].ptr_ +
                                                                8) + 4 + (lVar12 - 1U >> 0x1c) * 8)
                                            + (ulong)(uVar4 >> 0xc & 0xfff8))),pcVar13,__n);
          pcVar13 = pcVar13 + __n;
          lVar12 = lVar12 + __n;
          uVar8 = uVar8 - __n;
        } while (uVar8 != 0);
        lVar5 = (long)(int)lVar5 + uVar11;
      } while (src_byte_len != (byte *)0x0);
    }
  }
  else {
    vVar2 = CVmBif::get_charset_obj(mapval);
    local_140 = CVmObjCharSet::get_to_local
                          ((CVmObjCharSet *)
                           ((long)&G_obj_table_X.pages_[vVar2 >> 0xc]->ptr_ +
                           (ulong)((vVar2 & 0xfff) * 0x18)));
    sVar6 = CCharmapToLocal::map_utf8
                      (local_140,(char *)0x0,0,(char *)src,(size_t)src_byte_len,&local_148);
    vVar2 = create(0,sVar6);
    if (src_byte_len != (byte *)0x0) {
      pCVar1 = G_obj_table_X.pages_[vVar2 >> 0xc];
      local_160 = 1;
      do {
        sVar6 = CCharmapToLocal::map_utf8
                          (local_140,local_138,0x80,(char *)src,(size_t)src_byte_len,&local_148);
        if (sVar6 != 0) {
          pcVar13 = local_138;
          sVar9 = sVar6;
          lVar5 = local_160;
          do {
            uVar4 = (uint)(lVar5 - 1U);
            uVar11 = (ulong)(uVar4 & 0x7fff);
            uVar8 = 0x8000 - uVar11;
            if (sVar9 <= uVar8) {
              uVar8 = sVar9;
            }
            memcpy((void *)(uVar11 + *(long *)(*(long *)(*(long *)((long)&pCVar1[vVar2 & 0xfff].ptr_
                                                                  + 8) + 4 +
                                                        (lVar5 - 1U >> 0x1c) * 8) +
                                              (ulong)(uVar4 >> 0xc & 0xfff8))),pcVar13,uVar8);
            pcVar13 = pcVar13 + uVar8;
            lVar5 = lVar5 + uVar8;
            sVar9 = sVar9 - uVar8;
          } while (sVar9 != 0);
        }
        local_160 = local_160 + sVar6;
        src = src + local_148;
        src_byte_len = src_byte_len + -local_148;
      } while (src_byte_len != (byte *)0x0);
    }
  }
  return vVar2;
}

Assistant:

vm_obj_id_t CVmObjByteArray::create_from_string(
    VMG_ const vm_val_t *strval, const char *str, const vm_val_t *mapval)
{
    /* we can't allocate our object until we know the mapped byte count */
    vm_obj_id_t id = VM_INVALID_OBJ;
    CVmObjByteArray *arr = 0;
    
    /* get the string's length and skip the length prefix */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /*
     *   We have two modes: map to bytes via a character set, or stuff
     *   unmapped character values into bytes.  Check which mode we're using.
     */
    if (mapval == 0 || mapval->typ == VM_NIL)
    {
        /* 
         *   No character mapper - just stuff each character into a byte.  If
         *   a character is outside the 0..255 range, it's an error.  
         */

        /* count the number of characters */
        utf8_ptr p((char *)str);
        size_t clen = p.len(len);

        /* allocate the array - each string character is one array byte */
        id = create(vmg_ FALSE, clen);
        arr = (CVmObjByteArray *)vm_objp(vmg_ id);

        /* copy bytes into the array */
        for (int idx = 1 ; len != 0 ; )
        {
            /* translate a buffer-full */
            unsigned char buf[256];
            size_t cur = 0;
            for ( ; len != 0 && cur < sizeof(buf) ; p.inc(&len))
            {
                /* get the next character; make sure it fits in a byte */
                wchar_t ch = p.getch();
                if (ch > 255)
                    err_throw(VMERR_NUM_OVERFLOW);
                
                /* save it */
                buf[cur++] = (unsigned char)ch;
            }
            
            /* copy this chunk to the array */
            arr->cons_copy_from_buf(buf, idx, cur);
            idx += cur;
        }
    }
    else
    {
        /* interpret the character set argument */
        vm_obj_id_t mapid = CVmBif::get_charset_obj(vmg_ mapval);

        /* get the to-local mapping from the character set */
        CCharmapToLocal *mapper =
            ((CVmObjCharSet *)vm_objp(vmg_ mapid))->get_to_local(vmg0_);

        /* 
         *   first, do a mapping with a null output buffer to determine how
         *   many bytes we need for the mapping 
         */
        size_t src_bytes_used;
        size_t byte_len = mapper->map_utf8(0, 0, str, len, &src_bytes_used);
        
        /* allocate a new ByteArray with the required number of bytes */
        id = CVmObjByteArray::create(vmg_ FALSE, byte_len);
        arr = (CVmObjByteArray *)vm_objp(vmg_ id);
        
        /* convert it again, this time storing the bytes */
        for (size_t out_idx = 1 ; len != 0 ; )
        {
            char buf[128];
            
            /* convert a buffer-full */
            byte_len = mapper->map_utf8(buf, sizeof(buf), str, len,
                                        &src_bytes_used);
            
            /* store the bytes in the byte array */
            arr->cons_copy_from_buf((unsigned char *)buf, out_idx, byte_len);
            
            /* advance past the output bytes we used */
            out_idx += byte_len;
            
            /* advance past the source bytes we used */
            str += src_bytes_used;
            len -= src_bytes_used;
        }
    }

    /* return the new array's object ID */
    return id;
}